

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.cpp
# Opt level: O1

void __thiscall Corrade::Utility::Error::Error(Error *this,String *output,Flags flags)

{
  InternalFlags *pIVar1;
  undefined8 *puVar2;
  StringStream *this_00;
  
  puVar2 = (undefined8 *)__tls_get_addr(&PTR_0017ef88);
  Debug::Debug(&this->super_Debug,(ostream *)*puVar2,flags);
  this->_previousGlobalErrorOutput = (ostream *)puVar2[2];
  if (output == (String *)0x0) {
    this_00 = (StringStream *)0x0;
  }
  else {
    this_00 = (StringStream *)operator_new(0x178);
    StringStream::StringStream(this_00,output);
  }
  (this->super_Debug)._output = &this_00->super_ostream;
  puVar2[2] = this_00;
  pIVar1 = &(this->super_Debug)._internalFlags;
  pIVar1->_value = pIVar1->_value | 1;
  return;
}

Assistant:

Error::Error(Containers::String* const output, const Flags flags): Debug{flags} {
    /* Save previous global output and replace it with current one */
    _previousGlobalErrorOutput = debugGlobals.errorOutput;
    /** @todo any better idea how to do these two lines without duplicating
        them in Debug, Warning and Error? */
    debugGlobals.errorOutput = _output = output ? new StringStream{*output} : nullptr;
    _internalFlags |= InternalFlag::OwnedStream;
}